

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int __thiscall ghc::filesystem::remove(filesystem *this,char *__filename)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  error_code eVar4;
  
  std::error_code::clear((error_code *)__filename);
  iVar1 = ::remove(*(char **)this);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      return 0;
    }
    eVar4 = detail::make_system_error(0);
    uVar3 = eVar4._0_8_;
    *(int *)__filename = eVar4._M_value;
    *(error_category **)(__filename + 8) = eVar4._M_cat;
  }
  else {
    uVar3 = (ulong)*(uint *)__filename;
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),(int)uVar3 == 0);
}

Assistant:

GHC_INLINE bool remove(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
#ifdef GHC_USE_WCHAR_T
    auto cstr = p.c_str();
#else
    std::wstring np = detail::fromUtf8<std::wstring>(p.u8string());
    auto cstr = np.c_str();
#endif
    DWORD attr = GetFileAttributesW(cstr);
    if (attr == INVALID_FILE_ATTRIBUTES) {
        auto error = ::GetLastError();
        if (error == ERROR_FILE_NOT_FOUND || error == ERROR_PATH_NOT_FOUND) {
            return false;
        }
        ec = detail::make_system_error(error);
    }
    else if (attr & FILE_ATTRIBUTE_READONLY) {
        auto new_attr = attr & ~static_cast<DWORD>(FILE_ATTRIBUTE_READONLY);
        if (!SetFileAttributesW(cstr, new_attr)) {
            auto error = ::GetLastError();
            ec = detail::make_system_error(error);
        }
    }
    if (!ec) {
        if (attr & FILE_ATTRIBUTE_DIRECTORY) {
            if (!RemoveDirectoryW(cstr)) {
                ec = detail::make_system_error();
            }
        }
        else {
            if (!DeleteFileW(cstr)) {
                ec = detail::make_system_error();
            }
        }
    }
#else
    if (::remove(p.c_str()) == -1) {
        auto error = errno;
        if (error == ENOENT) {
            return false;
        }
        ec = detail::make_system_error();
    }
#endif
    return ec ? false : true;
}